

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O2

void __thiscall Automaton::buildDefaultReduceActions(Automaton *this)

{
  _List_node_base **pp_Var1;
  _List_iterator<Item> _Var2;
  int iVar3;
  _List_node_base *p_Var4;
  int iVar5;
  _List_node_base *p_Var6;
  long in_FS_OFFSET;
  _List_iterator<Item> local_a0;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  local_98;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var4 = (_List_node_base *)&this->states;
  while (p_Var4 = (((_List_base<State,_std::allocator<State>_> *)&p_Var4->_M_next)->_M_impl)._M_node
                  .super__List_node_base._M_next, p_Var4 != (_List_node_base *)&this->states) {
    pp_Var1 = (_List_node_base **)((long)(p_Var4 + 1 + 1) + 8);
    local_a0._M_node = (_List_node_base *)pp_Var1;
    _Var2._M_node = (_List_node_base *)pp_Var1;
    iVar3 = -1;
    while (iVar5 = iVar3, p_Var6 = _Var2._M_node, local_a0._M_node = (local_a0._M_node)->_M_next,
          local_a0._M_node != (_List_node_base *)pp_Var1) {
      _Var2._M_node = p_Var6;
      iVar3 = iVar5;
      if (local_a0._M_node[1]._M_prev == (_List_node_base *)&local_a0._M_node[1]._M_next[1]._M_prev)
      {
        local_98._M_impl._0_8_ = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98._M_impl.super__Rb_tree_header._M_header;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::value((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 *)&local_68,&this->lookaheads,&local_a0,
                (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 *)&local_98);
        iVar3 = (int)local_68._M_impl.super__Rb_tree_header._M_node_count;
        std::
        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~_Rb_tree(&local_68);
        std::
        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~_Rb_tree(&local_98);
        _Var2._M_node = local_a0._M_node;
        if ((p_Var6 != (_List_node_base *)pp_Var1) && (iVar3 <= iVar5)) {
          _Var2._M_node = p_Var6;
          iVar3 = iVar5;
        }
      }
    }
    if (p_Var6 != (_List_node_base *)pp_Var1) {
      *(_List_node_base **)((long)(p_Var4 + 4 + 1) + 8) = p_Var6[1]._M_next;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildDefaultReduceActions ()
{
  for (StatePointer state = states.begin (); state != states.end (); ++state)
    {
      ItemPointer def = state->closure.end ();
      int size = -1;

      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs ())
            continue;

          int la = static_cast<int>(lookaheads.value(item).size());
          if (def == state->closure.end () || la > size)
            {
              def = item;
              size = la;
            }
        }

      if (def != state->closure.end ())
        {
          Q_ASSERT (size >= 0);
          state->defaultReduce = def->rule;
        }
    }
}